

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_details.cxx
# Opt level: O0

void __thiscall read_color_index::operator()(read_color_index *this,color_index **_ci,xr_reader *r)

{
  uint8_t uVar1;
  uint32_t uVar2;
  color_index *this_00;
  color_index *ci;
  xr_reader *r_local;
  color_index **_ci_local;
  read_color_index *this_local;
  
  this_00 = (color_index *)operator_new(0x20);
  xray_re::color_index::color_index(this_00);
  *_ci = this_00;
  uVar2 = xray_re::xr_reader::r_u32(r);
  this_00->color = uVar2;
  uVar1 = xray_re::xr_reader::r_u8(r);
  xray_re::xr_reader::
  r_seq<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,xray_re::xr_reader::f_r_sz>
            (r,uVar1,&this_00->references);
  return;
}

Assistant:

void operator()(color_index*& _ci, xr_reader& r) {
	color_index* ci = new color_index;
	_ci = ci;
	ci->color = r.r_u32();
	r.r_seq(r.r_u8(), ci->references, xr_reader::f_r_sz());
}